

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeSetStabLimDet(void *cvode_mem,int sldet)

{
  int in_ESI;
  CVodeMem in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetStabLimDet","cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if ((in_ESI == 0) || (in_RDI->cv_lmm == 2)) {
    in_RDI->cv_sldeton = in_ESI;
    local_4 = 0;
  }
  else {
    cvProcessError(in_RDI,-0x16,"CVODE","CVodeSetStabLimDet",
                   "Attempt to use stability limit detection with the CV_ADAMS method illegal.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeSetStabLimDet(void *cvode_mem, booleantype sldet)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetStabLimDet", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  if( sldet && (cv_mem->cv_lmm != CV_BDF) ) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetStabLimDet", MSGCV_SET_SLDET);
    return(CV_ILL_INPUT);
  }

  cv_mem->cv_sldeton = sldet;

  return(CV_SUCCESS);
}